

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int algo16_len(uchar *algo16)

{
  bool bVar1;
  int local_14;
  int algo16_len;
  uchar *algo16_local;
  
  local_14 = 0x10;
  while( true ) {
    bVar1 = false;
    if (0 < local_14) {
      bVar1 = algo16[local_14 + -1] == '\0';
    }
    if (!bVar1) break;
    local_14 = local_14 + -1;
  }
  return local_14;
}

Assistant:

static int algo16_len(const unsigned char *algo16) {
    int algo16_len = 16;

     /* Remove terminating null bytes */
     while (algo16_len > 0 && !algo16[algo16_len - 1]) {
        algo16_len--;
     }
     return algo16_len;
}